

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall
DynamicGraph::updateVisitedComponents
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *visited)

{
  value_type vVar1;
  bool bVar2;
  reference puVar3;
  reference pvVar4;
  unsigned_long v;
  const_iterator __end1;
  const_iterator __begin1;
  list<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  list<unsigned_long,_std::allocator<unsigned_long>_> *visited_local;
  DynamicGraph *this_local;
  
  this->nextComponent = this->nextComponent + 1;
  __end1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin(visited);
  v = (unsigned_long)std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(visited)
  ;
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&v);
    if (!bVar2) break;
    puVar3 = std::_List_const_iterator<unsigned_long>::operator*(&__end1);
    vVar1 = this->nextComponent;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->components,*puVar3);
    *pvVar4 = vVar1;
    std::_List_const_iterator<unsigned_long>::operator++(&__end1);
  }
  return;
}

Assistant:

void DynamicGraph::updateVisitedComponents(const std::list<Vertex>& visited)
{
    this->nextComponent++;
    for (unsigned long v : visited) {
        this->components[v] = this->nextComponent;
    }
}